

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O3

bool __thiscall urllib::Request::addHeader(Request *this,string *key,string *value)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __it;
  __normal_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  header;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  string *local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  __it._M_current =
       (this->headers_).
       super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->headers_).
           super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = local_40;
  pcVar2 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + key->_M_string_length);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_50,local_50 + local_48);
  paVar6 = &local_d8.first.field_2;
  local_d8.first._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_90,local_90 + local_88);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_d8.first._M_dataplus._M_p,
             local_d8.first._M_dataplus._M_p + local_d8.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p != paVar6) {
    operator_delete(local_d8.first._M_dataplus._M_p);
  }
  local_d8.first._M_dataplus._M_p = (pointer)paVar6;
  local_98 = key;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_70,local_70 + local_68);
  lVar7 = (long)ppVar1 - (long)__it._M_current;
  if (0 < lVar7 >> 8) {
    lVar4 = (lVar7 >> 8) + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_d8,__it);
      _Var5._M_current = __it._M_current;
      if (bVar3) goto LAB_00104d6f;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_d8,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_00104d6f;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_d8,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_00104d6f;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                            *)&local_d8,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_00104d6f;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
      lVar7 = lVar7 + -0x100;
    } while (1 < lVar4);
  }
  lVar7 = lVar7 >> 6;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      _Var5._M_current = ppVar1;
      if ((lVar7 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                                *)&local_d8,__it), _Var5._M_current = __it._M_current, bVar3))
      goto LAB_00104d6f;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                          *)&local_d8,__it);
    _Var5._M_current = __it._M_current;
    if (bVar3) goto LAB_00104d6f;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0>
          ::operator()((_Iter_pred<urllib::Request::addHeader(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                        *)&local_d8,__it);
  _Var5._M_current = ppVar1;
  if (bVar3) {
    _Var5._M_current = __it._M_current;
  }
LAB_00104d6f:
  paVar6 = &local_d8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p != paVar6) {
    operator_delete(local_d8.first._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (_Var5._M_current ==
      (this->headers_).
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_d8,local_98,value);
    std::
    vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&this->headers_,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.second._M_dataplus._M_p != &local_d8.second.field_2) {
      operator_delete(local_d8.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != paVar6) {
      operator_delete(local_d8.first._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&(_Var5._M_current)->second);
  }
  return true;
}

Assistant:

bool Request::addHeader(const string& key, const string& value)
{
    auto iter = std::find_if(headers_.begin(), headers_.end(),
            [key](pair<const string, string> header)
            { return header.first == key; });

    if (iter == headers_.end())
    {
        pair<const string, string> header(key, value);
        headers_.push_back(header);
    }
    else
    {
        iter->second = value;
    }

    return true;
}